

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_StartScript(FParser *this)

{
  uint uVar1;
  DFraggleThinker *this_00;
  DFsScript *pDVar2;
  DRunningScript *this_01;
  AActor *trigger;
  
  if (this->t_argc != 1) {
    script_error("incorrect arguments to function\n");
    return;
  }
  uVar1 = intvalue(this->t_argv);
  if (0x100 < uVar1) {
    script_error("script number %d out of range\n",(ulong)uVar1);
    return;
  }
  this_00 = GC::ReadBarrier<DFraggleThinker>((DFraggleThinker **)&DFraggleThinker::ActiveThinker);
  if (this_00 != (DFraggleThinker *)0x0) {
    pDVar2 = GC::ReadBarrier<DFsScript>((DFsScript **)&this_00->LevelScript);
    pDVar2 = GC::ReadBarrier<DFsScript>((DFsScript **)(pDVar2->children + uVar1));
    if (pDVar2 == (DFsScript *)0x0) {
      script_error("script %i not defined\n",(ulong)uVar1);
    }
    this_01 = (DRunningScript *)DObject::operator_new(0xd8);
    trigger = GC::ReadBarrier<AActor>((AActor **)&this->Script->trigger);
    DRunningScript::DRunningScript(this_01,trigger,pDVar2,0);
    DFraggleThinker::AddRunningScript(this_00,this_01);
    return;
  }
  return;
}

Assistant:

void FParser::SF_StartScript()
{
	if(t_argc != 1)
	{
		script_error("incorrect arguments to function\n");
		return;
	}
	
	int snum = intvalue(t_argv[0]);

	if(snum < 0 || snum >= MAXSCRIPTS)
	{
		script_error("script number %d out of range\n",snum);
		return;
	}

	DFraggleThinker *th = DFraggleThinker::ActiveThinker;
	if (th)
	{

		DFsScript *script = th->LevelScript->children[snum];
	
		if(!script)
		{
			script_error("script %i not defined\n", snum);
		}
		
		DRunningScript *runscr = new DRunningScript(Script->trigger, script, 0);
		// hook into chain at start
		th->AddRunningScript(runscr);
	}
}